

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_isonumber.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  ulong uVar8;
  undefined **ppuVar9;
  bool bVar10;
  _Bool _Var11;
  isonumber_str buf;
  long local_78;
  ulong local_70;
  long local_60 [6];
  
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_str_from_isonumber_u64");
  local_70 = 1;
  do {
    puVar7 = &test_str_from_isonumber_u64_results;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        lVar6 = *(long *)((long)&test_str_from_isonumber_u64_tests + lVar5) + lVar4 + -1;
        _Var11 = false;
        pcVar3 = (char *)isonumber_from_u64(local_60,lVar6 * local_70,0,local_70,0);
        if (pcVar3 != (char *)0x0) {
          iVar2 = strcmp(pcVar3,*(char **)((long)puVar7 + lVar5));
          _Var11 = iVar2 == 0;
        }
        cunit_named_check(pcVar3 != (char *)0x0,"test_str_from_isonumber_u64",0x53,
                          "isonumber_from_u64(%lu) is not null",lVar6);
        cunit_named_check(_Var11,"test_str_from_isonumber_u64",0x55,
                          "isonumber_from_u64(%lu) = %s should be %s",lVar6,pcVar3,
                          *(undefined8 *)((long)puVar7 + lVar5));
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x28);
      lVar4 = lVar4 + 1;
      puVar7 = puVar7 + 5;
    } while (lVar4 != 3);
    bVar10 = local_70 < 0x11;
    local_70 = local_70 * 4;
  } while (bVar10);
  cunit_end_test("test_str_from_isonumber_u64");
  cunit_start_test("test_isonumber_to_u64_to_string");
  uVar8 = 1;
  do {
    lVar4 = 0;
    do {
      local_60[0] = 0;
      uVar1 = *(undefined8 *)((long)&test_isonumber_to_u64_to_string_tests + lVar4);
      iVar2 = isonumber_to_u64(local_60,uVar1,uVar8);
      cunit_named_check(iVar2 == 0,"test_isonumber_to_u64_to_string",0x6f,
                        "isonumber_to_u64(\"%s\") failed",uVar1);
      if (iVar2 == 0) {
        lVar5 = *(long *)((long)&test_isonumber_to_u64_to_string_results + lVar4) * uVar8;
        cunit_named_check(local_60[0] == lVar5,"test_isonumber_to_u64_to_string",0x72,
                          "isonumber_to_u64(\"%s\") != %lu (was %lu)",uVar1,lVar5,local_60[0]);
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x30);
    bVar10 = uVar8 < 0x11;
    uVar8 = uVar8 * 4;
  } while (bVar10);
  cunit_end_test("test_isonumber_to_u64_to_string");
  cunit_start_test("test_str_from_isonumber_s64");
  ppuVar9 = &test_str_from_isonumber_s64_results;
  local_78 = 0;
  do {
    lVar4 = 0;
    do {
      lVar5 = (*(long *)((long)&test_str_from_isonumber_s64_tests + lVar4) - local_78) + 1;
      _Var11 = false;
      pcVar3 = (char *)isonumber_from_s64(local_60,lVar5,0,1,0);
      if (pcVar3 != (char *)0x0) {
        iVar2 = strcmp(pcVar3,*(char **)((long)ppuVar9 + lVar4));
        _Var11 = iVar2 == 0;
      }
      cunit_named_check(pcVar3 != (char *)0x0,"test_str_from_isonumber_s64",0xae,
                        "str_to_isonumber_s64(%ld) is not null",lVar5);
      cunit_named_check(_Var11,"test_str_from_isonumber_s64",0xb1,
                        "str_to_isonumber_s64(%ld) = %s should be %s",lVar5,pcVar3,
                        *(undefined8 *)((long)ppuVar9 + lVar4));
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x28);
    local_78 = local_78 + 1;
    ppuVar9 = ppuVar9 + 5;
  } while (local_78 != 3);
  cunit_end_test("test_str_from_isonumber_s64");
  cunit_start_test("test_isonumber_to_s64_to_string");
  lVar4 = 0;
  do {
    local_60[0] = 0;
    uVar1 = *(undefined8 *)((long)&test_isonumber_to_s64_to_string_tests + lVar4);
    iVar2 = isonumber_to_s64(local_60,uVar1,1);
    cunit_named_check(iVar2 == 0,"test_isonumber_to_s64_to_string",0x8e,
                      "isonumber_to_u64(\"%s\") failed",uVar1);
    if (iVar2 == 0) {
      cunit_named_check(local_60[0] ==
                        *(long *)((long)&test_isonumber_to_s64_to_string_results + lVar4),
                        "test_isonumber_to_s64_to_string",0x91,
                        "isonumber_to_u64(\"%s\") != %ld (was %ld)",uVar1,
                        *(long *)((long)&test_isonumber_to_s64_to_string_results + lVar4),
                        local_60[0]);
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x50);
  cunit_end_test("test_isonumber_to_s64_to_string");
  cunit_start_test("test_str_from_isonumber_s64_2");
  lVar4 = isonumber_from_s64(local_60,0x47f5000000000000,"bit/s",1,0);
  cunit_named_check(lVar4 != 0,"test_str_from_isonumber_s64_2",0xbf,"test");
  cunit_end_test("test_str_from_isonumber_s64_2");
  iVar2 = FINISH_TESTING();
  return iVar2;
}

Assistant:

int
main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(clear_elements);

  test_str_from_isonumber_u64();
  test_isonumber_to_u64_to_string();

  test_str_from_isonumber_s64();
  test_isonumber_to_s64_to_string();
  test_str_from_isonumber_s64_2();

  return FINISH_TESTING();
}